

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::TryFindFileInFallbackDatabase
          (DescriptorPool *this,StringPiece name)

{
  int iVar1;
  const_iterator cVar2;
  FileDescriptor *pFVar3;
  bool bVar4;
  string name_string;
  __node_gen_type __node_gen;
  FileDescriptorProto file_proto;
  StringPiece local_128;
  string local_118;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  FileDescriptorProto local_f0;
  
  local_128.length_ = name.length_;
  local_128.ptr_ = name.ptr_;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_118,&local_128);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(((this->tables_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl)->known_bad_files_)._M_h,&local_118);
  if (cVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    bVar4 = false;
    goto LAB_0034c79a;
  }
  FileDescriptorProto::FileDescriptorProto(&local_f0,(Arena *)0x0,false);
  iVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[2])
                    (this->fallback_database_,&local_118,&local_f0);
  if ((char)iVar1 == '\0') {
LAB_0034c774:
    local_f8 = &((this->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                _M_head_impl)->known_bad_files_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_f8,&local_118);
    bVar4 = false;
  }
  else {
    pFVar3 = BuildFileFromDatabase(this,&local_f0);
    bVar4 = true;
    if (pFVar3 == (FileDescriptor *)0x0) goto LAB_0034c774;
  }
  FileDescriptorProto::~FileDescriptorProto(&local_f0);
LAB_0034c79a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool DescriptorPool::TryFindFileInFallbackDatabase(
    StringPiece name) const {
  if (fallback_database_ == nullptr) return false;

  auto name_string = std::string(name);
  if (tables_->known_bad_files_.count(name_string) > 0) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileByName(name_string, &file_proto) ||
      BuildFileFromDatabase(file_proto) == nullptr) {
    tables_->known_bad_files_.insert(std::move(name_string));
    return false;
  }
  return true;
}